

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SilentEntitySystem.cpp
# Opt level: O2

void __thiscall
KDIS::DATA_TYPE::SilentEntitySystem::Encode(SilentEntitySystem *this,KDataStream *stream)

{
  pointer pEVar1;
  pointer pEVar2;
  
  KDataStream::Write<unsigned_short>(stream,this->m_ui16NumEnts);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16NumOfAppearanceRecords);
  (*(this->m_EntTyp).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_EntTyp,stream);
  pEVar1 = (this->m_vEA).
           super__Vector_base<KDIS::DATA_TYPE::EntityAppearance,_std::allocator<KDIS::DATA_TYPE::EntityAppearance>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pEVar2 = (this->m_vEA).
                super__Vector_base<KDIS::DATA_TYPE::EntityAppearance,_std::allocator<KDIS::DATA_TYPE::EntityAppearance>_>
                ._M_impl.super__Vector_impl_data._M_start; pEVar2 != pEVar1; pEVar2 = pEVar2 + 1) {
    (*(pEVar2->super_DataTypeBase)._vptr_DataTypeBase[5])(pEVar2,stream);
  }
  return;
}

Assistant:

void SilentEntitySystem::Encode( KDataStream & stream ) const
{
    stream << m_ui16NumEnts
           << m_ui16NumOfAppearanceRecords
           << KDIS_STREAM m_EntTyp;

    vector<EntityAppearance>::const_iterator citr = m_vEA.begin();
    vector<EntityAppearance>::const_iterator citrEnd = m_vEA.end();
    for( ; citr != citrEnd; ++citr )
    {
        citr->Encode( stream );
    }
}